

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O1

int ptls_buffer_push_asn1_ubigint(ptls_buffer_t *buf,void *bignum,size_t size)

{
  char *pcVar1;
  uint8_t *puVar2;
  bool bVar3;
  int iVar4;
  ulong uVar5;
  size_t sVar6;
  size_t len;
  char *in_RCX;
  long lVar7;
  st_ptls_key_schedule_t *sched;
  uint uVar8;
  char *pcVar9;
  ptls_buffer_t *ppVar10;
  ushort in_R8W;
  size_t sVar11;
  size_t sVar12;
  timeval tStack_68;
  ptls_buffer_t *ppStack_58;
  char *pcStack_50;
  size_t sStack_48;
  size_t sStack_40;
  char *pcStack_38;
  
  pcVar1 = (char *)((long)bignum + size);
  if (0 < (long)size) {
    for (; *bignum == '\0'; bignum = (void *)((long)bignum + 1)) {
      size = size - 1;
      if ((long)size < 1) {
        size = 0;
        bignum = pcVar1;
        break;
      }
    }
  }
  iVar4 = ptls_buffer_reserve(buf,1);
  if (iVar4 == 0) {
    in_RCX = (char *)buf->off;
    in_RCX[(long)buf->base] = '\x02';
    buf->off = buf->off + 1;
    iVar4 = 0;
  }
  if (iVar4 != 0) {
    return iVar4;
  }
  iVar4 = ptls_buffer_reserve(buf,1);
  if (iVar4 == 0) {
    in_RCX = (char *)buf->off;
    in_RCX[(long)buf->base] = -1;
    buf->off = buf->off + 1;
    iVar4 = 0;
  }
  if (iVar4 != 0) {
    return iVar4;
  }
  sVar11 = buf->off;
  if (*bignum < '\0') {
    iVar4 = ptls_buffer_reserve(buf,1);
    if (iVar4 == 0) {
      in_RCX = (char *)buf->off;
      in_RCX[(long)buf->base] = '\0';
      buf->off = buf->off + 1;
      iVar4 = 0;
    }
    if (iVar4 != 0) {
      return iVar4;
    }
  }
  ppVar10 = buf;
  if ((char *)bignum == pcVar1) {
    uVar8 = 1;
    iVar4 = ptls_buffer_reserve(buf,1);
    if (iVar4 == 0) {
      in_RCX = (char *)buf->off;
      in_RCX[(long)buf->base] = '\0';
      buf->off = buf->off + 1;
      goto LAB_00105aea;
    }
  }
  else {
    sVar12 = size;
    iVar4 = ptls_buffer_reserve(buf,size);
    uVar8 = (uint)sVar12;
    if (iVar4 == 0) {
      ppVar10 = (ptls_buffer_t *)(buf->base + buf->off);
      pcVar9 = (char *)bignum;
      memcpy(ppVar10,bignum,size);
      uVar8 = (uint)pcVar9;
      buf->off = buf->off + size;
LAB_00105aea:
      iVar4 = 0;
    }
  }
  if (iVar4 != 0) {
    return iVar4;
  }
  uVar5 = buf->off - sVar11;
  if (uVar5 < 0x80) {
    buf->base[sVar11 - 1] = (uint8_t)uVar5;
    return 0;
  }
  ptls_buffer_push_asn1_ubigint_cold_1();
  ppStack_58 = buf;
  pcStack_50 = pcVar1;
  sStack_48 = sVar11;
  sStack_40 = size;
  pcStack_38 = (char *)bignum;
  iVar4 = ptls_buffer_reserve(ppVar10,2);
  if (iVar4 == 0) {
    puVar2 = ppVar10->base;
    sVar11 = ppVar10->off;
    (puVar2 + sVar11)[0] = '\0';
    (puVar2 + sVar11)[1] = '\0';
    ppVar10->off = ppVar10->off + 2;
    iVar4 = 0;
  }
  if (iVar4 != 0) {
    return iVar4;
  }
  sVar11 = ppVar10->off;
  gettimeofday(&tStack_68,(__timezone_ptr_t)0x0);
  iVar4 = ptls_buffer_reserve(ppVar10,8);
  if (iVar4 == 0) {
    uVar5 = tStack_68.tv_sec * 1000 + tStack_68.tv_usec / 1000;
    *(ulong *)(ppVar10->base + ppVar10->off) =
         uVar5 >> 0x38 | (uVar5 & 0xff000000000000) >> 0x28 | (uVar5 & 0xff0000000000) >> 0x18 |
         (uVar5 & 0xff00000000) >> 8 | (uVar5 & 0xff000000) << 8 | (uVar5 & 0xff0000) << 0x18 |
         (uVar5 & 0xff00) << 0x28 | uVar5 << 0x38;
    ppVar10->off = ppVar10->off + 8;
    iVar4 = 0;
  }
  if (iVar4 != 0) {
    return iVar4;
  }
  iVar4 = ptls_buffer_reserve(ppVar10,2);
  if (iVar4 == 0) {
    puVar2 = ppVar10->base;
    sVar12 = ppVar10->off;
    (puVar2 + sVar12)[0] = '\0';
    (puVar2 + sVar12)[1] = '\0';
    ppVar10->off = ppVar10->off + 2;
    iVar4 = 0;
  }
  if (iVar4 == 0) {
    sVar12 = ppVar10->off;
    iVar4 = ptls_buffer_reserve(ppVar10,sched->algo->digest_size);
    if ((iVar4 == 0) &&
       (iVar4 = derive_secret(sched,ppVar10->base + ppVar10->off,"resumption master secret"),
       iVar4 == 0)) {
      sVar6 = ppVar10->off + sched->algo->digest_size;
      ppVar10->off = sVar6;
      uVar5 = sVar6 - sVar12;
      lVar7 = 8;
      do {
        ppVar10->base[sVar12 - 2] = (uint8_t)(uVar5 >> ((byte)lVar7 & 0x3f));
        lVar7 = lVar7 + -8;
        sVar12 = sVar12 + 1;
      } while (lVar7 != -8);
      iVar4 = 0;
      bVar3 = true;
    }
    else {
      bVar3 = false;
    }
  }
  else {
    bVar3 = false;
  }
  if (!bVar3) {
    return iVar4;
  }
  iVar4 = ptls_buffer_reserve(ppVar10,2);
  if (iVar4 == 0) {
    *(ushort *)(ppVar10->base + ppVar10->off) = in_R8W << 8 | in_R8W >> 8;
    ppVar10->off = ppVar10->off + 2;
    iVar4 = 0;
  }
  if (iVar4 != 0) {
    return iVar4;
  }
  iVar4 = ptls_buffer_reserve(ppVar10,4);
  if (iVar4 == 0) {
    *(uint *)(ppVar10->base + ppVar10->off) =
         uVar8 >> 0x18 | (uVar8 & 0xff0000) >> 8 | (uVar8 & 0xff00) << 8 | uVar8 << 0x18;
    ppVar10->off = ppVar10->off + 4;
    iVar4 = 0;
  }
  if (iVar4 != 0) {
    return iVar4;
  }
  iVar4 = ptls_buffer_reserve(ppVar10,2);
  if (iVar4 == 0) {
    puVar2 = ppVar10->base;
    sVar12 = ppVar10->off;
    (puVar2 + sVar12)[0] = '\0';
    (puVar2 + sVar12)[1] = '\0';
    ppVar10->off = ppVar10->off + 2;
    iVar4 = 0;
  }
  if (iVar4 == 0) {
    sVar12 = ppVar10->off;
    if (in_RCX != (char *)0x0) {
      len = strlen(in_RCX);
      iVar4 = ptls_buffer__do_pushv(ppVar10,in_RCX,len);
      if (iVar4 != 0) goto LAB_00105ce7;
    }
    uVar5 = ppVar10->off - sVar12;
    lVar7 = 8;
    do {
      ppVar10->base[sVar12 - 2] = (uint8_t)(uVar5 >> ((byte)lVar7 & 0x3f));
      lVar7 = lVar7 + -8;
      sVar12 = sVar12 + 1;
    } while (lVar7 != -8);
    iVar4 = 0;
    bVar3 = true;
  }
  else {
LAB_00105ce7:
    bVar3 = false;
  }
  if (bVar3) {
    uVar5 = ppVar10->off - sVar11;
    lVar7 = 8;
    do {
      ppVar10->base[sVar11 - 2] = (uint8_t)(uVar5 >> ((byte)lVar7 & 0x3f));
      lVar7 = lVar7 + -8;
      sVar11 = sVar11 + 1;
    } while (lVar7 != -8);
  }
  return iVar4;
}

Assistant:

int ptls_buffer_push_asn1_ubigint(ptls_buffer_t *buf, const void *bignum, size_t size)
{
    const uint8_t *p = bignum, *end = p + size;
    int ret;

    /* skip zeroes */
    for (; end - p >= 1; ++p)
        if (*p != 0)
            break;

    /* emit */
    ptls_buffer_push(buf, 2);
    ptls_buffer_push_asn1_block(buf, {
        if (*p >= 0x80)
            ptls_buffer_push(buf, 0);
        if (p != end) {
            ptls_buffer_pushv(buf, p, end - p);
        } else {
            ptls_buffer_pushv(buf, "", 1);
        }
    });
    ret = 0;

Exit:
    return ret;
}